

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Prepare(sqlite3 *db,char *zSql,int nBytes,u32 prepFlags,Vdbe *pReprepare,
                  sqlite3_stmt **ppStmt,char **pzTail)

{
  Btree *pBVar1;
  sqlite3 *db_00;
  Vdbe *pVVar2;
  TriggerPrg *p;
  int iVar3;
  char *zSql_00;
  char *pcVar4;
  u8 uVar5;
  long lVar6;
  long lVar7;
  ulong n;
  u32 local_1e4;
  sqlite3_stmt **local_1e0;
  char *local_1d8;
  Parse local_1d0;
  
  local_1e0 = ppStmt;
  memset(&local_1d0.zErrMsg,0,0xd8);
  memset(&local_1d0.sLastToken,0,0x88);
  local_1d0.pOuterParse = db->pParse;
  db->pParse = &local_1d0;
  local_1d0.db = db;
  local_1d0.pReprepare = pReprepare;
  if (db->mallocFailed != '\0') {
    sqlite3ErrorMsg(&local_1d0,"out of memory");
  }
  uVar5 = (u8)prepFlags;
  if ((prepFlags & 1) != 0) {
    local_1d0.disableLookaside = local_1d0.disableLookaside + '\x01';
    (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
    (db->lookaside).sz = 0;
  }
  local_1d8 = zSql;
  local_1d0.prepFlags = uVar5;
  if (db->noSharedCache == '\0') {
    lVar6 = 0;
    for (lVar7 = 0; lVar7 < db->nDb; lVar7 = lVar7 + 1) {
      pBVar1 = *(Btree **)((long)&db->aDb->pBt + lVar6);
      if (pBVar1 != (Btree *)0x0) {
        sqlite3BtreeEnter(pBVar1);
        iVar3 = querySharedCacheTableLock(pBVar1,1,'\x01');
        sqlite3BtreeLeave(pBVar1);
        if (iVar3 != 0) {
          sqlite3ErrorWithMsg(db,iVar3,"database schema is locked: %s",
                              *(undefined8 *)((long)&db->aDb->zDbSName + lVar6));
          goto LAB_001782ec;
        }
      }
      lVar6 = lVar6 + 0x20;
    }
  }
  if (db->pDisconnect != (VTable *)0x0) {
    sqlite3VtabUnlockList(db);
  }
  pcVar4 = local_1d8;
  if ((nBytes < 0) || ((n = (ulong)(uint)nBytes, nBytes != 0 && (local_1d8[n - 1] == '\0')))) {
    sqlite3RunParser(&local_1d0,local_1d8);
  }
  else {
    if (db->aLimit[1] < nBytes) {
      sqlite3ErrorWithMsg(db,0x12,"statement too long");
      iVar3 = sqlite3ApiExit(db,0x12);
      goto LAB_001782ec;
    }
    zSql_00 = sqlite3DbStrNDup(db,local_1d8,n);
    if (zSql_00 == (char *)0x0) {
      local_1d0.zTail = pcVar4 + n;
    }
    else {
      sqlite3RunParser(&local_1d0,zSql_00);
      local_1d0.zTail = pcVar4 + ((long)local_1d0.zTail - (long)zSql_00);
      sqlite3DbFreeNN(db,zSql_00);
    }
  }
  pVVar2 = local_1d0.pVdbe;
  if (pzTail != (char **)0x0) {
    *pzTail = local_1d0.zTail;
  }
  if (((db->init).busy == '\0') && (local_1d0.pVdbe != (Vdbe *)0x0)) {
    (local_1d0.pVdbe)->prepFlags = uVar5;
    if (-1 < (char)uVar5) {
      (local_1d0.pVdbe)->expmask = 0;
    }
    pcVar4 = sqlite3DbStrNDup((local_1d0.pVdbe)->db,pcVar4,
                              (long)((int)local_1d0.zTail - (int)pcVar4));
    pVVar2->zSql = pcVar4;
  }
  db_00 = local_1d0.db;
  if (db->mallocFailed == '\0') {
    if ((local_1d0.rc != 0) && (local_1d0.rc != 0x65)) goto LAB_0017822b;
    *local_1e0 = (sqlite3_stmt *)local_1d0.pVdbe;
    db->errCode = 0;
    db->errByteOffset = -1;
    iVar3 = 0;
    if (db->pErr != (Mem *)0x0) {
      sqlite3VdbeMemSetNull(db->pErr);
      iVar3 = 0;
    }
  }
  else {
    local_1d0.rc = 7;
    local_1d0.checkSchema = '\0';
LAB_0017822b:
    if ((local_1d0.checkSchema != '\0') && ((db->init).busy == '\0')) {
      lVar6 = 0;
      for (lVar7 = 0; lVar7 < db_00->nDb; lVar7 = lVar7 + 1) {
        pBVar1 = *(Btree **)((long)&db_00->aDb->pBt + lVar6);
        if (pBVar1 != (Btree *)0x0) {
          uVar5 = pBVar1->inTrans;
          if (uVar5 == '\0') {
            iVar3 = sqlite3BtreeBeginTrans(pBVar1,0,(int *)0x0);
            if (iVar3 != 0) {
              if ((iVar3 == 0xc0a) || (iVar3 == 7)) {
                sqlite3OomFault(db_00);
                local_1d0.rc = 7;
              }
              break;
            }
          }
          sqlite3BtreeGetMeta(pBVar1,1,&local_1e4);
          if (local_1e4 != **(u32 **)((long)&db_00->aDb->pSchema + lVar6)) {
            sqlite3ResetOneSchema(db_00,(int)lVar7);
            local_1d0.rc = 0x11;
          }
          if (uVar5 == '\0') {
            sqlite3BtreeCommit(pBVar1);
          }
        }
        lVar6 = lVar6 + 0x20;
      }
    }
    if (local_1d0.pVdbe != (Vdbe *)0x0) {
      sqlite3VdbeFinalize(local_1d0.pVdbe);
    }
    iVar3 = local_1d0.rc;
    if (local_1d0.zErrMsg == (char *)0x0) {
      sqlite3Error(db,local_1d0.rc);
    }
    else {
      sqlite3ErrorWithMsg(db,local_1d0.rc,"%s");
      sqlite3DbFree(db,local_1d0.zErrMsg);
    }
  }
  while (p = local_1d0.pTriggerPrg, local_1d0.pTriggerPrg != (TriggerPrg *)0x0) {
    local_1d0.pTriggerPrg = (local_1d0.pTriggerPrg)->pNext;
    sqlite3DbFreeNN(db,p);
  }
LAB_001782ec:
  sqlite3ParseObjectReset(&local_1d0);
  return iVar3;
}

Assistant:

static int sqlite3Prepare(
  sqlite3 *db,              /* Database handle. */
  const char *zSql,         /* UTF-8 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  Vdbe *pReprepare,         /* VM being reprepared */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const char **pzTail       /* OUT: End of parsed string */
){
  int rc = SQLITE_OK;       /* Result code */
  int i;                    /* Loop counter */
  Parse sParse;             /* Parsing context */

  /* sqlite3ParseObjectInit(&sParse, db); // inlined for performance */
  memset(PARSE_HDR(&sParse), 0, PARSE_HDR_SZ);
  memset(PARSE_TAIL(&sParse), 0, PARSE_TAIL_SZ);
  sParse.pOuterParse = db->pParse;
  db->pParse = &sParse;
  sParse.db = db;
  sParse.pReprepare = pReprepare;
  assert( ppStmt && *ppStmt==0 );
  if( db->mallocFailed ) sqlite3ErrorMsg(&sParse, "out of memory");
  assert( sqlite3_mutex_held(db->mutex) );

  /* For a long-term use prepared statement avoid the use of
  ** lookaside memory.
  */
  if( prepFlags & SQLITE_PREPARE_PERSISTENT ){
    sParse.disableLookaside++;
    DisableLookaside;
  }
  sParse.prepFlags = prepFlags & 0xff;

  /* Check to verify that it is possible to get a read lock on all
  ** database schemas.  The inability to get a read lock indicates that
  ** some other database connection is holding a write-lock, which in
  ** turn means that the other connection has made uncommitted changes
  ** to the schema.
  **
  ** Were we to proceed and prepare the statement against the uncommitted
  ** schema changes and if those schema changes are subsequently rolled
  ** back and different changes are made in their place, then when this
  ** prepared statement goes to run the schema cookie would fail to detect
  ** the schema change.  Disaster would follow.
  **
  ** This thread is currently holding mutexes on all Btrees (because
  ** of the sqlite3BtreeEnterAll() in sqlite3LockAndPrepare()) so it
  ** is not possible for another thread to start a new schema change
  ** while this routine is running.  Hence, we do not need to hold
  ** locks on the schema, we just need to make sure nobody else is
  ** holding them.
  **
  ** Note that setting READ_UNCOMMITTED overrides most lock detection,
  ** but it does *not* override schema lock detection, so this all still
  ** works even if READ_UNCOMMITTED is set.
  */
  if( !db->noSharedCache ){
    for(i=0; i<db->nDb; i++) {
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        assert( sqlite3BtreeHoldsMutex(pBt) );
        rc = sqlite3BtreeSchemaLocked(pBt);
        if( rc ){
          const char *zDb = db->aDb[i].zDbSName;
          sqlite3ErrorWithMsg(db, rc, "database schema is locked: %s", zDb);
          testcase( db->flags & SQLITE_ReadUncommit );
          goto end_prepare;
        }
      }
    }
  }

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( db->pDisconnect ) sqlite3VtabUnlockList(db);
#endif

  if( nBytes>=0 && (nBytes==0 || zSql[nBytes-1]!=0) ){
    char *zSqlCopy;
    int mxLen = db->aLimit[SQLITE_LIMIT_SQL_LENGTH];
    testcase( nBytes==mxLen );
    testcase( nBytes==mxLen+1 );
    if( nBytes>mxLen ){
      sqlite3ErrorWithMsg(db, SQLITE_TOOBIG, "statement too long");
      rc = sqlite3ApiExit(db, SQLITE_TOOBIG);
      goto end_prepare;
    }
    zSqlCopy = sqlite3DbStrNDup(db, zSql, nBytes);
    if( zSqlCopy ){
      sqlite3RunParser(&sParse, zSqlCopy);
      sParse.zTail = &zSql[sParse.zTail-zSqlCopy];
      sqlite3DbFree(db, zSqlCopy);
    }else{
      sParse.zTail = &zSql[nBytes];
    }
  }else{
    sqlite3RunParser(&sParse, zSql);
  }
  assert( 0==sParse.nQueryLoop );

  if( pzTail ){
    *pzTail = sParse.zTail;
  }

  if( db->init.busy==0 ){
    sqlite3VdbeSetSql(sParse.pVdbe, zSql, (int)(sParse.zTail-zSql), prepFlags);
  }
  if( db->mallocFailed ){
    sParse.rc = SQLITE_NOMEM_BKPT;
    sParse.checkSchema = 0;
  }
  if( sParse.rc!=SQLITE_OK && sParse.rc!=SQLITE_DONE ){
    if( sParse.checkSchema && db->init.busy==0 ){
      schemaIsValid(&sParse);
    }
    if( sParse.pVdbe ){
      sqlite3VdbeFinalize(sParse.pVdbe);
    }
    assert( 0==(*ppStmt) );
    rc = sParse.rc;
    if( sParse.zErrMsg ){
      sqlite3ErrorWithMsg(db, rc, "%s", sParse.zErrMsg);
      sqlite3DbFree(db, sParse.zErrMsg);
    }else{
      sqlite3Error(db, rc);
    }
  }else{
    assert( sParse.zErrMsg==0 );
    *ppStmt = (sqlite3_stmt*)sParse.pVdbe;
    rc = SQLITE_OK;
    sqlite3ErrorClear(db);
  }


  /* Delete any TriggerPrg structures allocated while parsing this statement. */
  while( sParse.pTriggerPrg ){
    TriggerPrg *pT = sParse.pTriggerPrg;
    sParse.pTriggerPrg = pT->pNext;
    sqlite3DbFree(db, pT);
  }

end_prepare:

  sqlite3ParseObjectReset(&sParse);
  return rc;
}